

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator+=(base_uint<256U> *this,uint64_t b64)

{
  long lVar1;
  base_uint<256U> *in_RSI;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  base_uint<256U> b;
  undefined1 *b_00;
  base_uint<256U> *b_01;
  base_uint<256U> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  b_00 = &stack0xffffffffffffffd8;
  b_01 = in_RDI;
  base_uint(in_RSI);
  operator=(in_RSI,(uint64_t)b_00);
  operator+=(in_stack_ffffffffffffffd8,b_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator+=(uint64_t b64)
    {
        base_uint b;
        b = b64;
        *this += b;
        return *this;
    }